

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_pairs.cpp
# Opt level: O0

void __thiscall Name_pairs::read_names(Name_pairs *this)

{
  int iVar1;
  ulong uVar2;
  string local_b0;
  string local_90;
  string local_70;
  long local_50;
  size_t pos;
  string input;
  allocator<char> local_11;
  Name_pairs *local_10;
  Name_pairs *this_local;
  
  local_10 = this;
  std::operator<<((ostream *)&std::cout,"Enter list of names delimited with comma:\n");
  if (read_names()::delimeter_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&read_names()::delimeter_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&read_names()::delimeter_abi_cxx11_,",",&local_11);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(std::__cxx11::string::~string,&read_names()::delimeter_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&read_names()::delimeter_abi_cxx11_);
    }
  }
  std::__cxx11::string::string((string *)&pos);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&pos);
  local_50 = 0;
  while( true ) {
    local_50 = std::__cxx11::string::find((string *)&pos,0x10f230);
    if (local_50 == -1) break;
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&pos);
    trim(&local_70,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->name,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::erase((ulong)&pos,0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    trim(&local_b0,(string *)&pos);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->name,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

void Name_pairs::read_names()
{
	std::cout << "Enter list of names delimited with comma:\n";
	static const std::string delimeter = ",";
	std::string input;
	std::getline(std::cin, input);
	size_t pos = 0;
	while ((pos = input.find(delimeter)) != std::string::npos)
	{
		name.push_back(trim(input.substr(0, pos)));
		input.erase(0, pos + 1);
	}
	// handle cases when there is one more name after delimiter
	if (!input.empty())
		name.push_back(trim(input));
}